

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  Curl_share *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  Curl_llist *list;
  ulong uVar4;
  Curl_llist_node *n;
  connectdata *pcVar5;
  size_t sVar6;
  timediff_t tVar7;
  connectdata *pcVar8;
  ulong uVar9;
  Curl_multi *pCVar10;
  cpool *cpool;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  curltime cVar14;
  curltime newer;
  curltime older;
  
  if (data == (Curl_easy *)0x0) {
    return 0;
  }
  pCVar1 = data->share;
  if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
    pCVar10 = data->multi_easy;
    if ((pCVar10 == (Curl_multi *)0x0) && (pCVar10 = data->multi, pCVar10 == (Curl_multi *)0x0)) {
      return 0;
    }
    cpool = &pCVar10->cpool;
  }
  else {
    cpool = &pCVar1->cpool;
  }
  pCVar10 = data->multi;
  if (pCVar10 == (Curl_multi *)0x0) {
    uVar9 = 0;
    uVar12 = 0;
  }
  else {
    uVar9 = pCVar10->max_host_connections;
    uVar12 = pCVar10->max_total_connections;
  }
  if (uVar9 == 0 && uVar12 == 0) {
    return 0;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x98 = cpool->field_0x98 | 1;
  if ((uVar9 == 0) ||
     (list = (Curl_llist *)
             Curl_hash_pick(&cpool->dest2bundle,conn->destination,conn->destination_len),
     list == (Curl_llist *)0x0)) {
    if (uVar12 == 0) {
      uVar13 = 0;
      goto LAB_0011932d;
    }
  }
  else {
    uVar4 = Curl_llist_count(list);
    while (uVar9 <= uVar4) {
      cVar14 = Curl_now();
      n = Curl_llist_head(list);
      if (n == (Curl_llist_node *)0x0) break;
      lVar11 = -1;
      pcVar8 = (connectdata *)0x0;
      do {
        pcVar5 = (connectdata *)Curl_node_elem(n);
        sVar6 = Curl_llist_count(&pcVar5->easyq);
        if ((sVar6 == 0) &&
           (uVar2 = (pcVar5->lastused).tv_sec, uVar3 = (pcVar5->lastused).tv_usec,
           older.tv_usec = uVar3, older.tv_sec = uVar2, newer._12_4_ = 0,
           newer.tv_sec = SUB128(cVar14._0_12_,0), newer.tv_usec = SUB124(cVar14._0_12_,8),
           older._12_4_ = 0, tVar7 = Curl_timediff(newer,older), lVar11 < tVar7)) {
          lVar11 = tVar7;
          pcVar8 = pcVar5;
        }
        n = Curl_node_next(n);
      } while (n != (Curl_llist_node *)0x0);
      if (pcVar8 == (connectdata *)0x0) break;
      Curl_cpool_disconnect(data,pcVar8,false);
      uVar4 = Curl_llist_count(list);
    }
    sVar6 = Curl_llist_count(list);
    uVar13 = (uint)(uVar9 <= sVar6);
    if ((uVar9 <= sVar6) || (uVar12 == 0)) goto LAB_0011932d;
  }
  while (uVar9 = cpool->num_conn, uVar12 <= uVar9) {
    pcVar8 = cpool_get_oldest_idle(cpool);
    if (pcVar8 == (connectdata *)0x0) {
      uVar9 = cpool->num_conn;
      break;
    }
    Curl_cpool_disconnect(data,pcVar8,false);
  }
  uVar13 = (uint)(uVar12 <= uVar9) * 2;
LAB_0011932d:
  cpool->field_0x98 = cpool->field_0x98 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return uVar13;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(data && data->multi) {
    dest_limit = data->multi->max_host_connections;
    total_limit = data->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool);
  if(dest_limit) {
    bundle = cpool_find_bundle(cpool, conn);
    while(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      struct connectdata *oldest_idle = NULL;
      /* The bundle is full. Extract the oldest connection that may
       * be removed now, if there is one. */
      oldest_idle = cpool_bundle_get_oldest_idle(bundle);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach destination "
                   "limit of %zu", oldest_idle->connection_id,
                   Curl_llist_count(&bundle->conns), dest_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);
    }
    if(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    while(cpool->num_conn >= total_limit) {
      struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);
    }
    if(cpool->num_conn >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool);
  return result;
}